

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_grouping.cpp
# Opt level: O0

Grouper icu_63::number::impl::Grouper::forProperties(DecimalFormatProperties *properties)

{
  Grouper GVar1;
  int16_t local_4e;
  short local_4c;
  short local_4a;
  int16_t minGrouping;
  int16_t grouping2;
  undefined8 uStack_30;
  int16_t grouping1;
  UNumberGroupingStrategy local_28;
  DecimalFormatProperties *properties_local;
  undefined2 uStack_10;
  undefined2 uStack_e;
  UNumberGroupingStrategy local_c;
  
  if ((properties->groupingUsed & 1U) == 0) {
    GVar1 = forStrategy(UNUM_GROUPING_OFF);
    uStack_30 = GVar1._0_8_;
    stack0xffffffffffffffec = uStack_30;
    local_28 = GVar1.fStrategy;
    local_c = local_28;
  }
  else {
    local_4c = (short)properties->groupingSize;
    local_4e = (int16_t)properties->secondaryGroupingSize;
    local_4a = local_4c;
    if (local_4c < 1) {
      if (0 < local_4e) {
        local_4c = local_4e;
      }
      local_4a = local_4c;
    }
    if (local_4e < 1) {
      local_4e = local_4a;
    }
    Grouper((Grouper *)((long)&properties_local + 4),local_4a,local_4e,
            (int16_t)properties->minimumGroupingDigits,UNUM_GROUPING_COUNT);
  }
  GVar1.fStrategy = local_c;
  GVar1.fGrouping1 = properties_local._4_2_;
  GVar1.fGrouping2 = properties_local._6_2_;
  GVar1.fMinGrouping = uStack_10;
  GVar1._6_2_ = uStack_e;
  return GVar1;
}

Assistant:

Grouper Grouper::forProperties(const DecimalFormatProperties& properties) {
    if (!properties.groupingUsed) {
        return forStrategy(UNUM_GROUPING_OFF);
    }
    auto grouping1 = static_cast<int16_t>(properties.groupingSize);
    auto grouping2 = static_cast<int16_t>(properties.secondaryGroupingSize);
    auto minGrouping = static_cast<int16_t>(properties.minimumGroupingDigits);
    grouping1 = grouping1 > 0 ? grouping1 : grouping2 > 0 ? grouping2 : grouping1;
    grouping2 = grouping2 > 0 ? grouping2 : grouping1;
    return {grouping1, grouping2, minGrouping, UNUM_GROUPING_COUNT};
}